

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

int ON_wString::CompareAttributeName(wchar_t *name1,wchar_t *name2)

{
  wchar_t *pwVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  
  if (name1 == name2) {
    return 0;
  }
  if (name2 != (wchar_t *)0x0 && name1 != (wchar_t *)0x0) {
    pwVar6 = name2;
    uVar2 = Internal_NameAttributeWideCharRank(*name1,SUB81(name2,0));
    uVar3 = Internal_NameAttributeWideCharRank(*name2,SUB81(pwVar6,0));
    pwVar5 = name2;
    if (uVar2 - 1 < 0xfffffffe && uVar2 == uVar3) {
      do {
        name2 = pwVar5 + 1;
        pwVar1 = name1 + 1;
        name1 = name1 + 1;
        uVar2 = Internal_NameAttributeWideCharRank(*pwVar1,SUB81(pwVar6,0));
        uVar3 = Internal_NameAttributeWideCharRank(pwVar5[1],SUB81(pwVar6,0));
        if (uVar2 != uVar3) break;
        pwVar5 = name2;
      } while (uVar2 - 1 < 0xfffffffe);
    }
    if ((uVar3 & uVar2) != 0xffffffff) {
      if (uVar2 < uVar3) {
        return -1;
      }
      if (uVar2 >= uVar3 && uVar2 != uVar3) {
        return 1;
      }
      if (uVar2 == 0) {
        return 0;
      }
    }
  }
  iVar4 = ON_StringCompareOrdinalUTF32((ON__UINT32 *)name1,-1,(ON__UINT32 *)name2,-1,true);
  return iVar4;
}

Assistant:

int ON_wString::CompareAttributeName(
  const wchar_t* name1,
  const wchar_t* name2
  )
{
  if (name1 == name2)
    return 0;

  const bool bIgnoreCase = true;

  if ( nullptr != name1 && nullptr != name2 )
  {
    // Sort leading underbar before 'A'
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-41224

    unsigned int rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
    unsigned int rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    while (rank1 == rank2 && ON_UNSET_UINT_INDEX != rank1 && 0 != rank1)
    {
      name1++;
      name2++;
      rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
      rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    }

    if (ON_UNSET_UINT_INDEX != rank1 || ON_UNSET_UINT_INDEX != rank2)
    {
      if (rank1 < rank2)
        return -1;
      if (rank1 > rank2)
        return 1;
      if (0 == rank1)
        return 0;
    }
  }

  // name1 or name2 is nullptr or begins with an unranked code point.
  return ON_wString::CompareOrdinal(name1, -1, name2, -1, bIgnoreCase);
}